

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories
               (cmXMLWriter *xml,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *includeDirs,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emittedDirs)

{
  bool bVar1;
  reference in_relative;
  ulong uVar2;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  _Base_ptr local_180;
  undefined1 local_178;
  _Self local_170;
  _Self local_168;
  string local_160;
  undefined1 local_130 [8];
  RegularExpression frameworkRx;
  string dir;
  string *inc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *emittedDirs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includeDirs_local;
  cmXMLWriter *xml_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(includeDirs);
  inc = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(includeDirs);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&inc), bVar1) {
    in_relative = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      cmsys::SystemTools::CollapseFullPath((string *)&frameworkRx.progsize,in_relative);
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)local_130,"(.+/Frameworks)/.+\\.framework/");
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_130,(string *)&frameworkRx.progsize);
      if (bVar1) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_160,(RegularExpression *)local_130,1);
        std::__cxx11::string::operator=((string *)&frameworkRx.progsize,(string *)&local_160);
        std::__cxx11::string::~string((string *)&local_160);
      }
      local_168._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(emittedDirs,(key_type *)&frameworkRx.progsize);
      local_170._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(emittedDirs);
      bVar1 = std::operator==(&local_168,&local_170);
      if (bVar1) {
        pVar3 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(emittedDirs,(value_type *)&frameworkRx.progsize);
        local_180 = (_Base_ptr)pVar3.first._M_node;
        local_178 = pVar3.second;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a0,"pathentry",&local_1a1);
        cmXMLWriter::StartElement(xml,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator(&local_1a1);
        GetEclipsePath(&local_1c8,(string *)&frameworkRx.progsize);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,"include",&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        cmXMLWriter::Attribute<char[4]>(xml,"kind",(char (*) [4])0x74d2bc);
        cmXMLWriter::Attribute<char[1]>(xml,"path",(char (*) [1])0x76e680);
        cmXMLWriter::Attribute<char[5]>(xml,"system",(char (*) [5])0x786ffe);
        cmXMLWriter::EndElement(xml);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_130);
      std::__cxx11::string::~string((string *)&frameworkRx.progsize);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories(
  cmXMLWriter& xml, const std::vector<std::string>& includeDirs,
  std::set<std::string>& emittedDirs)
{
  for (std::string const& inc : includeDirs) {
    if (!inc.empty()) {
      std::string dir = cmSystemTools::CollapseFullPath(inc);

      // handle framework include dirs on OSX, the remainder after the
      // Frameworks/ part has to be stripped
      //   /System/Library/Frameworks/GLUT.framework/Headers
      cmsys::RegularExpression frameworkRx("(.+/Frameworks)/.+\\.framework/");
      if (frameworkRx.find(dir)) {
        dir = frameworkRx.match(1);
      }

      if (emittedDirs.find(dir) == emittedDirs.end()) {
        emittedDirs.insert(dir);
        xml.StartElement("pathentry");
        xml.Attribute("include",
                      cmExtraEclipseCDT4Generator::GetEclipsePath(dir));
        xml.Attribute("kind", "inc");
        xml.Attribute("path", "");
        xml.Attribute("system", "true");
        xml.EndElement();
      }
    }
  }
}